

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcontrollers.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CSynchStateController::SetSignalCount(CSynchStateController *this,LONG lNewCount)

{
  CPalThread *pCVar1;
  LONG lNewCount_local;
  CSynchStateController *this_local;
  
  pCVar1 = InternalGetCurrentThread();
  if (pCVar1 != (this->super_CSynchControllerBase).m_pthrOwner) {
    fprintf(_stderr,"] %s %s:%d","SetSignalCount",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x233);
    fprintf(_stderr,"Expression: InternalGetCurrentThread() == m_pthrOwner\n");
  }
  if (lNewCount < 0) {
    fprintf(_stderr,"] %s %s:%d","SetSignalCount",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x234);
    fprintf(_stderr,"Expression: lNewCount >= 0\n");
  }
  CSynchData::Signal((this->super_CSynchControllerBase).m_psdSynchData,
                     (this->super_CSynchControllerBase).m_pthrOwner,lNewCount,false);
  return 0;
}

Assistant:

PAL_ERROR CSynchStateController::SetSignalCount(LONG lNewCount)
    {
        VALIDATEOBJECT(m_psdSynchData);

        _ASSERTE(InternalGetCurrentThread() == m_pthrOwner);
        _ASSERTE(lNewCount >= 0);
                    
        m_psdSynchData->Signal(m_pthrOwner, lNewCount, false);
        
        return NO_ERROR;
    }